

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

CuePoint * __thiscall mkvparser::Cues::GetFirst(Cues *this)

{
  CuePoint *pCVar1;
  CuePoint *pCVar2;
  
  pCVar2 = (CuePoint *)0x0;
  if ((this->m_cue_points != (CuePoint **)0x0) && (this->m_count != 0)) {
    pCVar1 = *this->m_cue_points;
    pCVar2 = (CuePoint *)0x0;
    if ((pCVar1 != (CuePoint *)0x0) && (pCVar2 = (CuePoint *)0x0, -1 < pCVar1->m_timecode)) {
      pCVar2 = pCVar1;
    }
  }
  return pCVar2;
}

Assistant:

const CuePoint* Cues::GetFirst() const {
  if (m_cue_points == NULL || m_count == 0)
    return NULL;

  CuePoint* const* const pp = m_cue_points;
  if (pp == NULL)
    return NULL;

  CuePoint* const pCP = pp[0];
  if (pCP == NULL || pCP->GetTimeCode() < 0)
    return NULL;

  return pCP;
}